

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O3

string * __thiscall
AC3Codec::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,AC3Codec *this)

{
  byte bVar1;
  MlpSubType MVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  string hd_type;
  ostringstream str;
  char *local_1b8;
  long local_1b0;
  char local_1a8;
  undefined7 uStack_1a7;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1b0 = 0;
  local_1a8 = '\0';
  MVar2 = (this->mlp).m_subType;
  pcVar7 = "UNKNOWN";
  if (MVar2 == stMLP) {
    pcVar7 = "MLP";
  }
  pcVar4 = "TRUE-HD";
  if (MVar2 != stTRUEHD) {
    pcVar4 = pcVar7;
  }
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_replace((ulong)&local_1b8,0,(char *)0x0,(ulong)pcVar4);
  if (this->m_true_hd_mode == true) {
    if (10 < this->m_bsid) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"E",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"AC3 core + ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,local_1b8,local_1b0);
    if ((this->mlp).m_substreams == '\x04') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," + ATMOS",8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Peak bitrate: ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,(this->mlp).m_bitrate / 1000);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Kbps (core ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_bit_rate / 1000);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Kbps) ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Sample Rate: ",0xd);
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)local_198,(this->mlp).m_samplerate / 1000);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"KHz ",4);
    if (this->m_sample_rate == (this->mlp).m_samplerate) goto LAB_001757ec;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," (core ",7);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,this->m_sample_rate / 1000);
    lVar5 = 5;
    pcVar7 = "Khz) ";
  }
  else {
    if (10 < this->m_bsid) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"EAC3 ",5);
    }
    if (this->m_isAtmos == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"+ ATMOS, ",9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Bitrate: ",9);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Kbps ",5);
    if (this->m_bit_rateExt != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"(core ",6);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,this->m_bit_rate / 1000);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Kbps) ",6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Sample Rate: ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,this->m_sample_rate / 1000);
    lVar5 = 4;
    pcVar7 = "KHz ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar5);
LAB_001757ec:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Channels: ",10);
  uVar6 = this->m_channels + 2;
  if (this->m_extChannelsExists == false) {
    uVar6 = (uint)this->m_channels;
  }
  bVar1 = (this->mlp).m_channels;
  if (bVar1 != 0) {
    uVar6 = (uint)bVar1;
  }
  if (this->m_lfeon == '\0') {
    std::ostream::operator<<((ostream *)local_198,uVar6);
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,uVar6 - 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".1",2);
  }
  std::__cxx11::stringbuf::str();
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

const std::string AC3Codec::getStreamInfo()
{
    std::ostringstream str;
    std::string hd_type;
    if (mlp.m_subType == MlpSubType::stTRUEHD)
        hd_type = "TRUE-HD";
    else
        hd_type = (mlp.m_subType == MlpSubType::stMLP) ? "MLP" : "UNKNOWN";

    if (m_true_hd_mode)
    {
        if (isEAC3())
            str << "E";
        str << "AC3 core + ";
        str << hd_type;
        if (mlp.m_substreams == 4)
            str << " + ATMOS";
        str << ". ";

        str << "Peak bitrate: " << mlp.m_bitrate / 1000 << "Kbps (core " << m_bit_rate / 1000 << "Kbps) ";
        str << "Sample Rate: " << mlp.m_samplerate / 1000 << "KHz ";
        if (m_sample_rate != mlp.m_samplerate)
            str << " (core " << m_sample_rate / 1000 << "Khz) ";
    }
    else
    {
        if (isEAC3())
            str << "EAC3 ";
        if (m_isAtmos)
            str << "+ ATMOS, ";

        str << "Bitrate: " << (m_bit_rate + m_bit_rateExt) / 1000 << "Kbps ";
        if (m_bit_rateExt)
            str << "(core " << m_bit_rate / 1000 << "Kbps) ";
        str << "Sample Rate: " << m_sample_rate / 1000 << "KHz ";
    }

    str << "Channels: ";
    int channels = m_channels;
    if (m_extChannelsExists)
        channels += 2;
    if (mlp.m_channels)
        channels = mlp.m_channels;

    if (m_lfeon)
        str << channels - 1 << ".1";
    else
        str << channels;
    return str.str();
}